

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

ExpectationBase * __thiscall
testing::internal::FunctionMocker<pstore::serialize::archive::void_type_(const_int_&)>::
UntypedFindMatchingExpectation
          (FunctionMocker<pstore::serialize::archive::void_type_(const_int_&)> *this,
          void *untyped_args,void **untyped_action,bool *is_excessive,ostream *what,ostream *why)

{
  bool bVar1;
  TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)> *this_00;
  Action<pstore::serialize::archive::void_type_(const_int_&)> *pAVar2;
  MutexLock l;
  GTestMutexLock local_40;
  void **local_38;
  
  local_40.mutex_ = (MutexBase *)g_gmock_mutex;
  local_38 = untyped_action;
  MutexBase::Lock((MutexBase *)g_gmock_mutex);
  this_00 = FindMatchingExpectationLocked(this,(ArgumentTuple *)untyped_args);
  if (this_00 == (TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)> *)0x0) {
    FormatUnexpectedCallMessageLocked(this,(ArgumentTuple *)untyped_args,what,why);
  }
  else {
    bVar1 = ExpectationBase::IsSaturated(&this_00->super_ExpectationBase);
    *is_excessive = bVar1;
    pAVar2 = TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)>::
             GetActionForArguments(this_00,this,(ArgumentTuple *)untyped_args,what,why);
    if (pAVar2 == (Action<pstore::serialize::archive::void_type_(const_int_&)> *)0x0) {
      pAVar2 = (Action<pstore::serialize::archive::void_type_(const_int_&)> *)0x0;
    }
    else if ((pAVar2->fun_).super__Function_base._M_manager == (_Manager_type)0x0) {
      pAVar2 = (Action<pstore::serialize::archive::void_type_(const_int_&)> *)0x0;
    }
    *local_38 = pAVar2;
  }
  GTestMutexLock::~GTestMutexLock(&local_40);
  return &this_00->super_ExpectationBase;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    MutexLock l(&g_gmock_mutex);
    TypedExpectation<F>* exp = this->FindMatchingExpectationLocked(args);
    if (exp == nullptr) {  // A match wasn't found.
      this->FormatUnexpectedCallMessageLocked(args, what, why);
      return nullptr;
    }

    // This line must be done before calling GetActionForArguments(),
    // which will increment the call count for *exp and thus affect
    // its saturation status.
    *is_excessive = exp->IsSaturated();
    const Action<F>* action = exp->GetActionForArguments(this, args, what, why);
    if (action != nullptr && action->IsDoDefault())
      action = nullptr;  // Normalize "do default" to NULL.
    *untyped_action = action;
    return exp;
  }